

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExperimentResult.cpp
# Opt level: O0

shared_ptr<celero::UserDefinedMeasurementCollector> __thiscall
celero::ExperimentResult::getUserDefinedMeasurements(ExperimentResult *this)

{
  Impl *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Pimpl<celero::ExperimentResult::Impl> *in_RSI;
  shared_ptr<celero::UserDefinedMeasurementCollector> sVar2;
  ExperimentResult *this_local;
  
  pIVar1 = Pimpl<celero::ExperimentResult::Impl>::operator->(in_RSI);
  std::shared_ptr<celero::UserDefinedMeasurementCollector>::shared_ptr
            ((shared_ptr<celero::UserDefinedMeasurementCollector> *)this,&pIVar1->udmCollector);
  sVar2.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<celero::UserDefinedMeasurementCollector>)
         sVar2.
         super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UserDefinedMeasurementCollector> ExperimentResult::getUserDefinedMeasurements() const
{
	return this->pimpl->udmCollector;
}